

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arbitrary.h
# Opt level: O0

array<ArbitraryTestsFixtures::UserDefinedType,_2UL> *
cppqc::ArbitraryImpl<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_>::unGen
          (RngEngine *rng,size_t size)

{
  array<ArbitraryTestsFixtures::UserDefinedType,_2UL> *in_RDI;
  undefined1 *size_00;
  RngEngine *in_stack_ffffffffffffffc0;
  Arbitrary<ArbitraryTestsFixtures::UserDefinedType> *in_stack_ffffffffffffffc8;
  StatelessGenerator<ArbitraryTestsFixtures::UserDefinedType> *in_stack_ffffffffffffffd0;
  StatelessGenerator<ArbitraryTestsFixtures::UserDefinedType> *in_stack_ffffffffffffffd8;
  
  size_00 = &stack0xffffffffffffffd8;
  StatelessGenerator<ArbitraryTestsFixtures::UserDefinedType>::
  StatelessGenerator<cppqc::Arbitrary<ArbitraryTestsFixtures::UserDefinedType>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  arrayOf<ArbitraryTestsFixtures::UserDefinedType,2ul>(in_stack_ffffffffffffffd8);
  StatelessGenerator<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_>::unGen
            ((StatelessGenerator<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_> *)
             in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,(size_t)size_00);
  StatelessGenerator<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_>::~StatelessGenerator
            ((StatelessGenerator<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_> *)
             0x3da108);
  StatelessGenerator<ArbitraryTestsFixtures::UserDefinedType>::~StatelessGenerator
            ((StatelessGenerator<ArbitraryTestsFixtures::UserDefinedType> *)0x3da112);
  return in_RDI;
}

Assistant:

static std::array<T, N> unGen(RngEngine& rng, std::size_t size) {
    return arrayOf<T, N>().unGen(rng, size);
  }